

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpconvert.cpp
# Opt level: O2

void __thiscall LpConvert::run(LpConvert *this)

{
  string *__lhs;
  string *__lhs_00;
  uint line;
  bool bVar1;
  char cVar2;
  int iVar3;
  ErrorHandler err;
  char *exp;
  Potassco *in;
  char *fmt;
  AspifTextOutput *pAVar4;
  ofstream *os;
  SmodelsConvert smodels;
  SmodelsOutput writer;
  AspifTextOutput text;
  ofstream oFile;
  ifstream iFile;
  
  in = (Potassco *)&iFile;
  std::ifstream::ifstream(in);
  os = &oFile;
  std::ofstream::ofstream(os);
  __lhs = &this->input_;
  if ((this->input_)._M_string_length != 0) {
    bVar1 = std::operator!=(__lhs,"-");
    if (bVar1) {
      std::ifstream::open((char *)&iFile,(_Ios_Openmode)(__lhs->_M_dataplus)._M_p);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        fmt = "Could not open input file!";
        exp = "iFile.is_open()";
        line = 0x5b;
        goto LAB_00106cde;
      }
    }
  }
  if ((this->output_)._M_string_length != 0) {
    __lhs_00 = &this->output_;
    bVar1 = std::operator!=(__lhs_00,"-");
    if (bVar1) {
      bVar1 = std::operator!=(__lhs,__lhs_00);
      if (bVar1) {
        std::ofstream::open((char *)&oFile,(_Ios_Openmode)(__lhs_00->_M_dataplus)._M_p);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 != '\0') goto LAB_00106b1e;
        fmt = "Could not open output file!";
        exp = "oFile.is_open()";
        line = 0x60;
      }
      else {
        fmt = "Input and output must be different!";
        exp = "input_ != output_";
        line = 0x5e;
      }
LAB_00106cde:
      Potassco::fail(-3,"virtual void LpConvert::run()",line,exp,fmt,0);
    }
  }
LAB_00106b1e:
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    in = (Potassco *)&std::cin;
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    os = (ofstream *)&std::cout;
  }
  Potassco::AspifTextOutput::AspifTextOutput(&text,(ostream *)os);
  iVar3 = std::istream::peek();
  if (iVar3 != 0x61) {
    iVar3 = std::istream::peek();
    if (9 < iVar3 - 0x30U) {
      Potassco::fail(-3,"virtual void LpConvert::run()",0x65,
                     "in.peek() == \'a\' || std::isdigit(in.peek())","Unrecognized input format!",0)
      ;
    }
  }
  iVar3 = std::istream::peek();
  if (iVar3 == 0x61) {
    err = (ErrorHandler)0x0;
    Potassco::SmodelsOutput::SmodelsOutput(&writer,(ostream *)os,this->potassco_,0);
    Potassco::SmodelsConvert::SmodelsConvert(&smodels,&writer.super_AbstractProgram,this->potassco_)
    ;
    pAVar4 = (AspifTextOutput *)&smodels;
    if (this->text_ != false) {
      pAVar4 = &text;
    }
    Potassco::readAspif(in,(istream *)pAVar4,(AbstractProgram *)error,err);
    Potassco::SmodelsConvert::~SmodelsConvert(&smodels);
  }
  else {
    Potassco::AspifOutput::AspifOutput((AspifOutput *)&writer,(ostream *)os);
    smodels.super_AbstractProgram._vptr_AbstractProgram._0_4_ = 0;
    if (this->potassco_ == true) {
      smodels.super_AbstractProgram._vptr_AbstractProgram._0_4_ = 0x10101;
      if (this->filter_ == true) {
        smodels.super_AbstractProgram._vptr_AbstractProgram._0_4_ = 0x1010101;
      }
    }
    pAVar4 = (AspifTextOutput *)&writer;
    if (this->text_ != false) {
      pAVar4 = &text;
    }
    Potassco::readSmodels((istream *)in,&pAVar4->super_AbstractProgram,error,(Options *)&smodels);
  }
  Potassco::AbstractProgram::~AbstractProgram(&writer.super_AbstractProgram);
  std::ifstream::close();
  std::ofstream::close();
  Potassco::AspifTextOutput::~AspifTextOutput(&text);
  std::ofstream::~ofstream(&oFile);
  std::ifstream::~ifstream(&iFile);
  return;
}

Assistant:

void LpConvert::run() {
	std::ifstream iFile;
	std::ofstream oFile;
	if (!input_.empty() && input_ != "-") {
		iFile.open(input_.c_str());
		POTASSCO_EXPECT(iFile.is_open(), "Could not open input file!");
	}
	if (!output_.empty() && output_ != "-") {
		POTASSCO_EXPECT(input_ != output_, "Input and output must be different!");
		oFile.open(output_.c_str());
		POTASSCO_EXPECT(oFile.is_open(), "Could not open output file!");
	}
	std::istream& in = iFile.is_open() ? iFile : std::cin;
	std::ostream& os = oFile.is_open() ? oFile : std::cout;
	Potassco::AspifTextOutput text(os);
	POTASSCO_EXPECT(in.peek() == 'a' || std::isdigit(in.peek()), "Unrecognized input format!");
	if (in.peek() == 'a') {
		Potassco::SmodelsOutput  writer(os, potassco_, 0);
		Potassco::SmodelsConvert smodels(writer, potassco_);
		Potassco::readAspif(in, !text_ ? static_cast<Potassco::AbstractProgram&>(smodels) : text, &error);
	}
	else {
		Potassco::AspifOutput aspif(os);
		Potassco::SmodelsInput::Options opts;
		if (potassco_) {
			opts.enableClaspExt().convertEdges().convertHeuristic();
			if (filter_) { opts.dropConverted(); }
		}
		Potassco::readSmodels(in, !text_? static_cast<Potassco::AbstractProgram&>(aspif) : text, &error, opts);
	}
	iFile.close();
	oFile.close();
}